

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.c
# Opt level: O0

void blake2b_digest(ssh_hash *hash,uint8_t *digest)

{
  uint local_ac;
  undefined1 local_a8 [4];
  uint i;
  uint8_t hash_pre [128];
  blake2b *s;
  uint8_t *digest_local;
  ssh_hash *hash_local;
  
  memset((undefined1 *)((long)&hash[-3].vt[-3].extra + 4) + (long)&hash->vt,0,
         0x80 - (long)hash[-3].vt);
  f_outer((uint64_t *)&hash[-0x10].binarysink_,(uint8_t *)((long)&hash[-0xc].binarysink_ + 4),
          (uint64_t)hash[-3].binarysink_,(uint64_t)hash[-2].vt,1);
  for (local_ac = 0; local_ac < 8; local_ac = local_ac + 1) {
    PUT_64BIT_LSB_FIRST(local_a8 + (local_ac << 3),(uint64_t)(&hash[-0x10].binarysink_)[local_ac]);
  }
  memcpy(digest,local_a8,(ulong)*(uint *)&hash[-0xc].binarysink_);
  smemclr(local_a8,0x80);
  return;
}

Assistant:

static void blake2b_digest(ssh_hash *hash, uint8_t *digest)
{
    blake2b *s = container_of(hash, blake2b, hash);

    memset(s->block + s->used, 0, sizeof(s->block) - s->used);
    f_outer(s->h, s->block, s->lenhi, s->lenlo, 1);

    uint8_t hash_pre[128];
    for (unsigned i = 0; i < 8; i++)
        PUT_64BIT_LSB_FIRST(hash_pre + 8*i, s->h[i]);
    memcpy(digest, hash_pre, s->hashlen);
    smemclr(hash_pre, sizeof(hash_pre));
}